

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O0

void nk_glfw3_font_stash_end(void)

{
  nk_handle texture;
  int local_18;
  int local_14;
  int h;
  int w;
  void *image;
  
  _h = nk_font_atlas_bake(&glfw.atlas,&local_14,&local_18,NK_FONT_ATLAS_RGBA32);
  nk_glfw3_device_upload_atlas(_h,local_14,local_18);
  texture = nk_handle_id(glfw.ogl.font_tex);
  nk_font_atlas_end(&glfw.atlas,texture,&glfw.ogl.null);
  if (glfw.atlas.default_font != (nk_font *)0x0) {
    nk_style_set_font(&glfw.ctx,&(glfw.atlas.default_font)->handle);
  }
  return;
}

Assistant:

NK_API void
nk_glfw3_font_stash_end(void)
{
    const void *image; int w, h;
    image = nk_font_atlas_bake(&glfw.atlas, &w, &h, NK_FONT_ATLAS_RGBA32);
    nk_glfw3_device_upload_atlas(image, w, h);
    nk_font_atlas_end(&glfw.atlas, nk_handle_id((int)glfw.ogl.font_tex), &glfw.ogl.null);
    if (glfw.atlas.default_font)
        nk_style_set_font(&glfw.ctx, &glfw.atlas.default_font->handle);
}